

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

_Bool tcg_out_sti(TCGContext_conflict9 *s,TCGType_conflict type,TCGArg val,TCGReg base,intptr_t ofs)

{
  uint local_3c;
  int rexw;
  intptr_t ofs_local;
  TCGReg base_local;
  TCGArg val_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *s_local;
  
  local_3c = 0;
  if (type == TCG_TYPE_I64) {
    if (val != (long)(int)(uint32_t)val) {
      return false;
    }
    local_3c = 0x1000;
  }
  else if (type != TCG_TYPE_I32) {
    return false;
  }
  tcg_out_modrm_offset(s,local_3c | 199,0,base,ofs);
  tcg_out32(s,(uint32_t)val);
  return true;
}

Assistant:

static bool tcg_out_sti(TCGContext *s, TCGType type, TCGArg val,
                        TCGReg base, intptr_t ofs)
{
    int rexw = 0;
    if (TCG_TARGET_REG_BITS == 64 && type == TCG_TYPE_I64) {
        if (val != (int32_t)val) {
            return false;
        }
        rexw = P_REXW;
    } else if (type != TCG_TYPE_I32) {
        return false;
    }
    tcg_out_modrm_offset(s, OPC_MOVL_EvIz | rexw, 0, base, ofs);
    tcg_out32(s, val);
    return true;
}